

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

int IPdr_ManRebuildClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Pdr_Set_t *pCube;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Vec_t *p_01;
  uint i;
  long lVar5;
  uint local_3c;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    iVar4 = -1;
  }
  else {
    if (vClauses->nSize < 2) {
      __assert_fail("Vec_VecSize(vClauses) >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x10b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    pVVar3 = (Vec_Ptr_t *)p->vClauses;
    if (pVVar3->nSize != 0) {
      __assert_fail("Vec_VecSize(p->vClauses) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x10c,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    Vec_PtrGrow(pVVar3,2);
    for (lVar5 = (long)pVVar3->nSize; lVar5 < 2; lVar5 = lVar5 + 1) {
      pVVar2 = Vec_PtrAlloc(0);
      pVVar3->pArray[lVar5] = pVVar2;
    }
    pVVar3->nSize = 2;
    IPdr_ManSetSolver(p,0,1);
    local_3c = 0;
    for (i = 1; (int)i < vClauses->nSize; i = i + 1) {
      pVVar3 = Vec_VecEntry(vClauses,i);
      for (iVar4 = 0; iVar4 < pVVar3->nSize; iVar4 = iVar4 + 1) {
        pCube = (Pdr_Set_t *)Vec_PtrEntry(pVVar3,iVar4);
        iVar1 = Pdr_ManCheckCube(p,0,pCube,(Pdr_Set_t **)0x0,0,0,1);
        p_00 = p->vActVars;
        Vec_IntWriteEntry(p_00,0,0);
        if (iVar1 == 0) {
          Abc_Print((int)p_00,"Cube[%d][%d] cannot be pushed from R0 to R1.\n",(ulong)i);
          Pdr_SetDeref(pCube);
        }
        else {
          if (iVar1 == -1) {
            __assert_fail("RetValue != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                          ,0x11b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
          }
          Vec_VecPush(p->vClauses,1,pCube);
        }
      }
      local_3c = local_3c + iVar4;
    }
    p_01 = p->vClauses;
    pVVar3 = Vec_VecEntry(p_01,1);
    iVar4 = 0;
    Abc_Print((int)p_01,"RebuildClauses: %d out of %d cubes reused in R1.\n",
              (ulong)(uint)pVVar3->nSize,(ulong)local_3c);
    IPdr_ManSetSolver(p,1,0);
    Vec_VecFree(vClauses);
  }
  return iVar4;
}

Assistant:

int IPdr_ManRebuildClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    int RetValue = -1;
    int nCubes = 0;

    if ( vClauses == NULL )
        return RetValue;

    assert( Vec_VecSize(vClauses) >= 2 );
    assert( Vec_VecSize(p->vClauses) == 0 ); 
    Vec_VecExpand( p->vClauses, 1 );

    IPdr_ManSetSolver( p, 0, 1 );

    // push clauses from R0 to R1
    Vec_VecForEachLevelStart( vClauses, vArrayK, i, 1 )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
        {
            ++nCubes;

            RetValue = Pdr_ManCheckCube( p, 0, pCube, NULL, 0, 0, 1 );
            Vec_IntWriteEntry( p->vActVars, 0, 0 );

            assert( RetValue != -1 );

            if ( RetValue == 0 )
            {
                Abc_Print( 1, "Cube[%d][%d] cannot be pushed from R0 to R1.\n", i, j );
                Pdr_SetDeref( pCube );
                continue;
            }

            Vec_VecPush( p->vClauses, 1, pCube );
        }
    }
    Abc_Print( 1, "RebuildClauses: %d out of %d cubes reused in R1.\n", Vec_PtrSize(Vec_VecEntry(p->vClauses, 1)), nCubes );
    IPdr_ManSetSolver( p, 1, 0 );
    Vec_VecFree( vClauses );

    /*
    for ( i = 1; i < Vec_VecSize( vClauses ) - 1; ++i )
    {
        vArrayK = IPdr_ManPushClausesK( p, i );
        if ( Vec_PtrSize(vArrayK) == 0 )
        {
            Abc_Print( 1, "RebuildClauses: stopped at frame %d.\n", i );
            break;
        }

        Vec_PtrGrow( (Vec_Ptr_t *)(p->vClauses), i + 2 );
        p->vClauses->nSize = i + 2;
        p->vClauses->pArray[i+1] = vArrayK;
        IPdr_ManSetSolver( p, i + 1, 0 );
    }

    Abc_Print( 1, "After rebuild:" );
    Vec_VecForEachLevel( p->vClauses, vArrayK, i )
        Abc_Print( 1, " %d", Vec_PtrSize( vArrayK ) );
    Abc_Print( 1, "\n" );
    */

    return 0;
}